

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-01.cpp
# Opt level: O2

int __thiscall
baryonyx::itm::
solver_inequalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>
::select_variables(solver_inequalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>
                   *this,int r_size,int bkmin,int bkmax)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  
  if (bkmin == bkmax) {
    if (r_size < bkmin) {
      bkmin = r_size;
    }
  }
  else {
    if (r_size < bkmax) {
      bkmax = r_size;
    }
    if (bkmin < r_size) {
      r_size = bkmin;
    }
    lVar3 = (long)r_size;
    lVar2 = lVar3 << 5;
    for (; bkmin = bkmax, lVar3 <= bkmax; lVar3 = lVar3 + 1) {
      bVar1 = stop_iterating<baryonyx::itm::minimize_tag,long_double>
                        (*(longdouble *)
                          ((long)&((this->R)._M_t.
                                   super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[]>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[]>_>
                                   .
                                   super__Head_base<0UL,_baryonyx::itm::solver_inequalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data_*,_false>
                                  ._M_head_impl)->value + lVar2),this->rng);
      if (bVar1) {
        bkmin = (int)lVar3;
        break;
      }
      lVar2 = lVar2 + 0x20;
    }
  }
  return bkmin + -1;
}

Assistant:

int select_variables(const int r_size, int bkmin, int bkmax)
    {
        if (bkmin == bkmax)
            return std::min(bkmin, r_size) - 1;

        bkmin = std::min(bkmin, r_size);
        bkmax = std::min(bkmax, r_size);

        for (int i = bkmin; i <= bkmax; ++i)
            if (stop_iterating<Mode>(R[i].value, rng))
                return i - 1;

        return bkmax - 1;
    }